

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O1

void Minisat::parseOptions(int *argc,char **argv,bool strict)

{
  char *pcVar1;
  char **ppcVar2;
  char cVar3;
  Option *pOVar4;
  int iVar5;
  char *pcVar6;
  vec<Minisat::Option_*,_int> *pvVar7;
  long lVar8;
  Option *pOVar9;
  Option *pOVar10;
  long lVar11;
  bool bVar12;
  int local_40;
  
  iVar5 = *argc;
  local_40 = 0;
  if (1 < iVar5) {
    local_40 = 1;
    lVar11 = 1;
    pOVar10 = (Option *)argc;
    do {
      lVar8 = lVar11;
      pcVar6 = argv[lVar8];
      if (*pcVar6 == '-') {
        pOVar9 = (Option *)0x1;
        do {
          if (pOVar9 == (Option *)0x2) {
            pcVar6 = pcVar6 + 2;
            bVar12 = true;
            goto LAB_0063127f;
          }
          cVar3 = *(char *)((long)&pOVar9[0x3a53f].description + 2);
          pOVar10 = (Option *)((long)&pOVar9->_vptr_Option + 1);
          pcVar1 = pcVar6 + (long)pOVar9;
          pOVar9 = pOVar10;
        } while (*pcVar1 == cVar3);
        bVar12 = cVar3 == '\0';
      }
      else {
        bVar12 = false;
      }
LAB_0063127f:
      if (bVar12) {
        bVar12 = *Option::getHelpPrefixString()::help_prefix_str == '\0';
        if (bVar12) {
          lVar11 = 0;
LAB_006312be:
          pcVar6 = pcVar6 + lVar11;
        }
        else if (*pcVar6 == *Option::getHelpPrefixString()::help_prefix_str) {
          lVar11 = 1;
          do {
            cVar3 = Option::getHelpPrefixString()::help_prefix_str[lVar11];
            pOVar10 = (Option *)CONCAT71((int7)((ulong)pOVar10 >> 8),cVar3);
            bVar12 = cVar3 == '\0';
            if (bVar12) goto LAB_006312be;
            pcVar1 = pcVar6 + lVar11;
            lVar11 = lVar11 + 1;
          } while (*pcVar1 == cVar3);
        }
        else {
          bVar12 = false;
        }
        if (!bVar12) goto LAB_0063133b;
        if (*pcVar6 == 'h') {
          pOVar9 = (Option *)0x1;
          do {
            if (pOVar9 == (Option *)0x4) {
              pcVar6 = pcVar6 + 4;
              bVar12 = true;
              goto LAB_006312fa;
            }
            cVar3 = *(char *)((long)&pOVar9[0x3aa29].type_name + 6);
            pOVar10 = (Option *)((long)&pOVar9->_vptr_Option + 1);
            pcVar1 = pcVar6 + (long)pOVar9;
            pOVar9 = pOVar10;
          } while (*pcVar1 == cVar3);
          bVar12 = cVar3 == '\0';
        }
        else {
          bVar12 = false;
        }
LAB_006312fa:
        iVar5 = (int)pOVar10;
        if (!bVar12) goto LAB_0063133b;
        if (*pcVar6 == '\0') goto LAB_00631426;
        if (*pcVar6 == '-') {
          pOVar9 = (Option *)0x0;
          do {
            if (pOVar9 == (Option *)0x4) goto LAB_00631411;
            pOVar4 = pOVar9 + 0x3a61c;
            pOVar10 = (Option *)((long)&pOVar9->_vptr_Option + 1);
            pcVar1 = pcVar6 + 1 + (long)pOVar9;
            pOVar9 = pOVar10;
          } while (*pcVar1 == *(char *)&pOVar4->description);
          if (*(char *)&pOVar4->description != '\0') goto LAB_006313e5;
LAB_00631411:
          printUsageAndExit((int)pOVar10,argv,true);
          goto LAB_0063141e;
        }
      }
      else {
LAB_0063133b:
        ppcVar2 = argv + lVar8;
        pvVar7 = Option::getOptionList();
        if (0 < pvVar7->sz) {
          lVar11 = 0;
          do {
            pvVar7 = Option::getOptionList();
            pOVar10 = pvVar7->data[lVar11];
            iVar5 = (*pOVar10->_vptr_Option[2])(pOVar10,*ppcVar2);
            if ((char)iVar5 != '\0') goto LAB_006313e5;
            lVar11 = lVar11 + 1;
            pvVar7 = Option::getOptionList();
          } while (lVar11 < pvVar7->sz);
        }
        if ((strict) && (pOVar10 = (Option *)*ppcVar2, *(char *)&pOVar10->_vptr_Option == '-')) {
LAB_0063141e:
          iVar5 = (int)pOVar10;
          parseOptions();
LAB_00631426:
          printUsageAndExit(iVar5,argv,false);
          return;
        }
        lVar11 = (long)local_40;
        local_40 = local_40 + 1;
        argv[lVar11] = *ppcVar2;
      }
LAB_006313e5:
      iVar5 = *argc;
      lVar11 = lVar8 + 1;
    } while (lVar8 + 1 < (long)iVar5);
    local_40 = local_40 + ~(uint)lVar8;
  }
  *argc = iVar5 + local_40;
  return;
}

Assistant:

void Minisat::parseOptions(int& argc, char** argv, bool strict)
{
    int i, j;
    for (i = j = 1; i < argc; i++){
        const char* str = argv[i];
        if (match(str, "--") && match(str, Option::getHelpPrefixString()) && match(str, "help")){
            if (*str == '\0')
                printUsageAndExit(argc, argv);
            else if (match(str, "-verb"))
                printUsageAndExit(argc, argv, true);
        } else {
            bool parsed_ok = false;
        
            for (int k = 0; !parsed_ok && k < Option::getOptionList().size(); k++){
                parsed_ok = Option::getOptionList()[k]->parse(argv[i]);

                // fprintf(stderr, "checking %d: %s against flag <%s> (%s)\n", i, argv[i], Option::getOptionList()[k]->name, parsed_ok ? "ok" : "skip");
            }

            if (!parsed_ok){
                if (strict && match(argv[i], "-"))
                    fprintf(stderr, "ERROR! Unknown flag \"%s\". Use '--%shelp' for help.\n", argv[i], Option::getHelpPrefixString()), exit(1);
                else
                    argv[j++] = argv[i];
            }
        }
    }

    argc -= (i - j);
}